

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimize.cc
# Opt level: O1

void kratos::MergeIfVisitor::transform_block(StmtBlock *block)

{
  size_type *psVar1;
  size_t *this;
  IfStmt *this_00;
  element_type *peVar2;
  shared_ptr<kratos::Stmt> *psVar3;
  element_type *peVar4;
  bool bVar5;
  mapped_type *ppIVar6;
  long *plVar7;
  _Rb_tree_node_base *p_Var8;
  shared_ptr<kratos::Stmt> *st;
  shared_ptr<kratos::Stmt> *psVar9;
  ulong uVar10;
  long *plVar11;
  pointer ppVar12;
  long *plVar13;
  type *stmt;
  undefined1 auVar14 [8];
  undefined1 local_120 [8];
  map<kratos::Var_*,_std::vector<std::pair<std::shared_ptr<kratos::IfStmt>,_std::shared_ptr<kratos::Const>_>,_std::allocator<std::pair<std::shared_ptr<kratos::IfStmt>,_std::shared_ptr<kratos::Const>_>_>_>,_std::less<kratos::Var_*>,_std::allocator<std::pair<kratos::Var_*const,_std::vector<std::pair<std::shared_ptr<kratos::IfStmt>,_std::shared_ptr<kratos::Const>_>,_std::allocator<std::pair<std::shared_ptr<kratos::IfStmt>,_std::shared_ptr<kratos::Const>_>_>_>_>_>_>
  result;
  unordered_map<long,_kratos::IfStmt_*,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_kratos::IfStmt_*>_>_>
  mapping;
  undefined1 local_a0 [8];
  unordered_set<kratos::IfStmt_*,_std::hash<kratos::IfStmt_*>,_std::equal_to<kratos::IfStmt_*>,_std::allocator<kratos::IfStmt_*>_>
  merged_if;
  undefined1 local_60 [8];
  vector<std::pair<std::shared_ptr<kratos::IfStmt>,_std::shared_ptr<kratos::Const>_>,_std::allocator<std::pair<std::shared_ptr<kratos::IfStmt>,_std::shared_ptr<kratos::Const>_>_>_>
  stmts;
  element_type *local_40;
  int64_t const_value;
  
  psVar1 = &merged_if._M_h._M_bucket_count;
  local_a0 = (undefined1  [8])psVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a0,"merge_if_block","");
  bVar5 = IRNode::has_attribute((IRNode *)block,(string *)local_a0);
  if (local_a0 != (undefined1  [8])psVar1) {
    operator_delete((void *)local_a0,merged_if._M_h._M_bucket_count + 1);
  }
  if (bVar5) {
    result._M_t._M_impl._0_4_ = 0;
    result._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    result._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
    result._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
    result._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)&result;
    result._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)&result;
    get_targeted_if(block,(map<kratos::Var_*,_std::vector<std::pair<std::shared_ptr<kratos::IfStmt>,_std::shared_ptr<kratos::Const>_>,_std::allocator<std::pair<std::shared_ptr<kratos::IfStmt>,_std::shared_ptr<kratos::Const>_>_>_>,_std::less<kratos::Var_*>,_std::allocator<std::pair<kratos::Var_*const,_std::vector<std::pair<std::shared_ptr<kratos::IfStmt>,_std::shared_ptr<kratos::Const>_>,_std::allocator<std::pair<std::shared_ptr<kratos::IfStmt>,_std::shared_ptr<kratos::Const>_>_>_>_>_>_>
                           *)local_120);
    local_a0 = (undefined1  [8])&merged_if._M_h._M_rehash_policy._M_next_resize;
    merged_if._M_h._M_buckets = (__buckets_ptr)0x1;
    merged_if._M_h._M_bucket_count = 0;
    merged_if._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    merged_if._M_h._M_element_count._0_4_ = 0x3f800000;
    merged_if._M_h._M_rehash_policy._M_max_load_factor = 0.0;
    merged_if._M_h._M_rehash_policy._4_4_ = 0;
    merged_if._M_h._M_rehash_policy._M_next_resize = 0;
    p_Var8 = result._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    if (result._M_t._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)&result) {
      do {
        std::
        vector<std::pair<std::shared_ptr<kratos::IfStmt>,_std::shared_ptr<kratos::Const>_>,_std::allocator<std::pair<std::shared_ptr<kratos::IfStmt>,_std::shared_ptr<kratos::Const>_>_>_>
        ::vector((vector<std::pair<std::shared_ptr<kratos::IfStmt>,_std::shared_ptr<kratos::Const>_>,_std::allocator<std::pair<std::shared_ptr<kratos::IfStmt>,_std::shared_ptr<kratos::Const>_>_>_>
                  *)local_60,
                 (vector<std::pair<std::shared_ptr<kratos::IfStmt>,_std::shared_ptr<kratos::Const>_>,_std::allocator<std::pair<std::shared_ptr<kratos::IfStmt>,_std::shared_ptr<kratos::Const>_>_>_>
                  *)&p_Var8[1]._M_parent);
        ppVar12 = stmts.
                  super__Vector_base<std::pair<std::shared_ptr<kratos::IfStmt>,_std::shared_ptr<kratos::Const>_>,_std::allocator<std::pair<std::shared_ptr<kratos::IfStmt>,_std::shared_ptr<kratos::Const>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        if (0x20 < (ulong)((long)stmts.
                                 super__Vector_base<std::pair<std::shared_ptr<kratos::IfStmt>,_std::shared_ptr<kratos::Const>_>,_std::allocator<std::pair<std::shared_ptr<kratos::IfStmt>,_std::shared_ptr<kratos::Const>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start - (long)local_60)) {
          mapping._M_h._M_single_bucket =
               (__node_base_ptr)
               (((shared_ptr<kratos::IfStmt> *)local_60)->
               super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
          merged_if._M_h._M_single_bucket =
               (__node_base_ptr)
               (((shared_ptr<kratos::IfStmt> *)local_60)->
               super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)merged_if._M_h._M_single_bucket !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)merged_if._M_h._M_single_bucket)->
              _M_use_count = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                             merged_if._M_h._M_single_bucket)->_M_use_count + 1;
              UNLOCK();
            }
            else {
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)merged_if._M_h._M_single_bucket)->
              _M_use_count = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                             merged_if._M_h._M_single_bucket)->_M_use_count + 1;
            }
          }
          result._M_t._M_impl.super__Rb_tree_header._M_node_count =
               (size_t)&mapping._M_h._M_rehash_policy._M_next_resize;
          mapping._M_h._M_buckets = (__buckets_ptr)0x1;
          mapping._M_h._M_bucket_count = 0;
          mapping._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
          mapping._M_h._M_element_count._0_4_ = 0x3f800000;
          mapping._M_h._M_rehash_policy._M_max_load_factor = 0.0;
          mapping._M_h._M_rehash_policy._4_4_ = 0;
          mapping._M_h._M_rehash_policy._M_next_resize = 0;
          for (auVar14 = local_60; auVar14 != (undefined1  [8])ppVar12;
              auVar14 = (undefined1  [8])((long)auVar14 + 0x20)) {
            local_40 = (element_type *)
                       ((((pointer)auVar14)->second).
                        super___shared_ptr<kratos::Const,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                       value_;
            plVar13 = *(long **)(result._M_t._M_impl.super__Rb_tree_header._M_node_count +
                                ((ulong)local_40 % (ulong)mapping._M_h._M_buckets) * 8);
            plVar7 = (long *)0x0;
            if ((plVar13 != (long *)0x0) &&
               (plVar7 = plVar13, plVar11 = (long *)*plVar13,
               local_40 != (element_type *)((long *)*plVar13)[1])) {
              while (plVar13 = (long *)*plVar11, plVar13 != (long *)0x0) {
                plVar7 = (long *)0x0;
                if (((ulong)plVar13[1] % (ulong)mapping._M_h._M_buckets !=
                     (ulong)local_40 % (ulong)mapping._M_h._M_buckets) ||
                   (plVar7 = plVar11, plVar11 = plVar13, local_40 == (element_type *)plVar13[1]))
                goto LAB_0020793f;
              }
              plVar7 = (long *)0x0;
            }
LAB_0020793f:
            if ((plVar7 == (long *)0x0) || (*plVar7 == 0)) {
              stmts.
              super__Vector_base<std::pair<std::shared_ptr<kratos::IfStmt>,_std::shared_ptr<kratos::Const>_>,_std::allocator<std::pair<std::shared_ptr<kratos::IfStmt>,_std::shared_ptr<kratos::Const>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage =
                   (pointer)(((pointer)auVar14)->first).
                            super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
              std::
              _Hashtable<long,std::pair<long_const,kratos::IfStmt*>,std::allocator<std::pair<long_const,kratos::IfStmt*>>,std::__detail::_Select1st,std::equal_to<long>,std::hash<long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              ::_M_emplace<long&,kratos::IfStmt*>
                        ((_Hashtable<long,std::pair<long_const,kratos::IfStmt*>,std::allocator<std::pair<long_const,kratos::IfStmt*>>,std::__detail::_Select1st,std::equal_to<long>,std::hash<long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                          *)&result._M_t._M_impl.super__Rb_tree_header._M_node_count,
                         &stack0xffffffffffffffc0,
                         &stmts.
                          super__Vector_base<std::pair<std::shared_ptr<kratos::IfStmt>,_std::shared_ptr<kratos::Const>_>,_std::allocator<std::pair<std::shared_ptr<kratos::IfStmt>,_std::shared_ptr<kratos::Const>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
            }
            else {
              ppIVar6 = std::__detail::
                        _Map_base<long,_std::pair<const_long,_kratos::IfStmt_*>,_std::allocator<std::pair<const_long,_kratos::IfStmt_*>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                        ::at((_Map_base<long,_std::pair<const_long,_kratos::IfStmt_*>,_std::allocator<std::pair<const_long,_kratos::IfStmt_*>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                              *)&result._M_t._M_impl.super__Rb_tree_header._M_node_count,
                             (key_type *)&stack0xffffffffffffffc0);
              this_00 = *ppIVar6;
              peVar2 = (((((pointer)auVar14)->first).
                         super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                       then_body_).
                       super___shared_ptr<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr;
              psVar3 = (peVar2->super_StmtBlock).stmts_.
                       super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
              for (psVar9 = *(shared_ptr<kratos::Stmt> **)
                             &(peVar2->super_StmtBlock).stmts_.
                              super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
                              ._M_impl; psVar9 != psVar3; psVar9 = psVar9 + 1) {
                IfStmt::add_then_stmt(this_00,psVar9);
              }
              peVar2 = (((((pointer)auVar14)->first).
                         super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                       else_body_).
                       super___shared_ptr<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr;
              psVar3 = (peVar2->super_StmtBlock).stmts_.
                       super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
              for (psVar9 = *(shared_ptr<kratos::Stmt> **)
                             &(peVar2->super_StmtBlock).stmts_.
                              super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
                              ._M_impl; psVar9 != psVar3; psVar9 = psVar9 + 1) {
                IfStmt::add_else_stmt(this_00,psVar9);
              }
              stmts.
              super__Vector_base<std::pair<std::shared_ptr<kratos::IfStmt>,_std::shared_ptr<kratos::Const>_>,_std::allocator<std::pair<std::shared_ptr<kratos::IfStmt>,_std::shared_ptr<kratos::Const>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage =
                   (pointer)(((pointer)auVar14)->first).
                            super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
              std::
              _Hashtable<kratos::IfStmt*,kratos::IfStmt*,std::allocator<kratos::IfStmt*>,std::__detail::_Identity,std::equal_to<kratos::IfStmt*>,std::hash<kratos::IfStmt*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
              ::_M_emplace<kratos::IfStmt*>
                        ((_Hashtable<kratos::IfStmt*,kratos::IfStmt*,std::allocator<kratos::IfStmt*>,std::__detail::_Identity,std::equal_to<kratos::IfStmt*>,std::hash<kratos::IfStmt*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                          *)local_a0,
                         &stmts.
                          super__Vector_base<std::pair<std::shared_ptr<kratos::IfStmt>,_std::shared_ptr<kratos::Const>_>,_std::allocator<std::pair<std::shared_ptr<kratos::IfStmt>,_std::shared_ptr<kratos::Const>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
            }
          }
          if (0x20 < (ulong)((long)stmts.
                                   super__Vector_base<std::pair<std::shared_ptr<kratos::IfStmt>,_std::shared_ptr<kratos::Const>_>,_std::allocator<std::pair<std::shared_ptr<kratos::IfStmt>,_std::shared_ptr<kratos::Const>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start - (long)local_60)) {
            uVar10 = 1;
            do {
              peVar4 = (((pointer)((long)local_60 + uVar10 * 0x20))->first).
                       super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
              plVar13 = *(long **)((long)local_a0 +
                                  ((ulong)peVar4 % (ulong)merged_if._M_h._M_buckets) * 8);
              plVar7 = (long *)0x0;
              if ((plVar13 != (long *)0x0) &&
                 (plVar7 = plVar13, plVar11 = (long *)*plVar13,
                 peVar4 != (element_type *)((long *)*plVar13)[1])) {
                while (plVar13 = (long *)*plVar11, plVar13 != (long *)0x0) {
                  plVar7 = (long *)0x0;
                  if (((ulong)plVar13[1] % (ulong)merged_if._M_h._M_buckets !=
                       (ulong)peVar4 % (ulong)merged_if._M_h._M_buckets) ||
                     (plVar7 = plVar11, plVar11 = plVar13, peVar4 == (element_type *)plVar13[1]))
                  goto LAB_00207a89;
                }
                plVar7 = (long *)0x0;
              }
LAB_00207a89:
              if ((plVar7 == (long *)0x0) || (*plVar7 == 0)) {
                ppVar12 = (pointer)((long)local_60 + uVar10 * 0x20);
                local_40 = (ppVar12->first).
                           super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
                const_value = (int64_t)(ppVar12->first).
                                       super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_refcount._M_pi;
                if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)const_value !=
                    (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  if (__libc_single_threaded == '\0') {
                    LOCK();
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)const_value)->_M_use_count =
                         ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)const_value)->_M_use_count
                         + 1;
                    UNLOCK();
                  }
                  else {
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)const_value)->_M_use_count =
                         ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)const_value)->_M_use_count
                         + 1;
                  }
                }
                IfStmt::add_else_stmt
                          ((IfStmt *)mapping._M_h._M_single_bucket,
                           (shared_ptr<kratos::Stmt> *)&stack0xffffffffffffffc0);
                if (const_value != 0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)const_value);
                }
                local_40 = (ppVar12->first).
                           super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
                std::
                _Hashtable<kratos::IfStmt*,kratos::IfStmt*,std::allocator<kratos::IfStmt*>,std::__detail::_Identity,std::equal_to<kratos::IfStmt*>,std::hash<kratos::IfStmt*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                ::_M_emplace<kratos::IfStmt*>
                          ((_Hashtable<kratos::IfStmt*,kratos::IfStmt*,std::allocator<kratos::IfStmt*>,std::__detail::_Identity,std::equal_to<kratos::IfStmt*>,std::hash<kratos::IfStmt*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                            *)local_a0,&stack0xffffffffffffffc0);
              }
              uVar10 = uVar10 + 1;
            } while (uVar10 < (ulong)((long)stmts.
                                            super__Vector_base<std::pair<std::shared_ptr<kratos::IfStmt>,_std::shared_ptr<kratos::Const>_>,_std::allocator<std::pair<std::shared_ptr<kratos::IfStmt>,_std::shared_ptr<kratos::Const>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start -
                                      (long)local_60 >> 5));
          }
          std::
          _Hashtable<long,_std::pair<const_long,_kratos::IfStmt_*>,_std::allocator<std::pair<const_long,_kratos::IfStmt_*>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::~_Hashtable((_Hashtable<long,_std::pair<const_long,_kratos::IfStmt_*>,_std::allocator<std::pair<const_long,_kratos::IfStmt_*>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                         *)&result._M_t._M_impl.super__Rb_tree_header._M_node_count);
          if (merged_if._M_h._M_single_bucket != (__node_base_ptr)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                       merged_if._M_h._M_single_bucket);
          }
        }
        std::
        vector<std::pair<std::shared_ptr<kratos::IfStmt>,_std::shared_ptr<kratos::Const>_>,_std::allocator<std::pair<std::shared_ptr<kratos::IfStmt>,_std::shared_ptr<kratos::Const>_>_>_>
        ::~vector((vector<std::pair<std::shared_ptr<kratos::IfStmt>,_std::shared_ptr<kratos::Const>_>,_std::allocator<std::pair<std::shared_ptr<kratos::IfStmt>,_std::shared_ptr<kratos::Const>_>_>_>
                   *)local_60);
        p_Var8 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var8);
      } while (p_Var8 != (_Rb_tree_node_base *)&result);
    }
    if (merged_if._M_h._M_bucket_count != 0) {
      this = &result._M_t._M_impl.super__Rb_tree_header._M_node_count;
      plVar13 = (long *)merged_if._M_h._M_bucket_count;
      do {
        std::__shared_ptr<kratos::Stmt,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<kratos::Stmt,void>
                  ((__shared_ptr<kratos::Stmt,(__gnu_cxx::_Lock_policy)2> *)this,
                   (__weak_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2> *)(plVar13[1] + 0x68));
        (*(block->super_Stmt).super_IRNode._vptr_IRNode[10])(block,this);
        if (mapping._M_h._M_buckets != (__buckets_ptr)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)mapping._M_h._M_buckets);
        }
        plVar13 = (long *)*plVar13;
      } while (plVar13 != (long *)0x0);
    }
    std::
    _Hashtable<kratos::IfStmt_*,_kratos::IfStmt_*,_std::allocator<kratos::IfStmt_*>,_std::__detail::_Identity,_std::equal_to<kratos::IfStmt_*>,_std::hash<kratos::IfStmt_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::~_Hashtable((_Hashtable<kratos::IfStmt_*,_kratos::IfStmt_*,_std::allocator<kratos::IfStmt_*>,_std::__detail::_Identity,_std::equal_to<kratos::IfStmt_*>,_std::hash<kratos::IfStmt_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                   *)local_a0);
    std::
    _Rb_tree<kratos::Var_*,_std::pair<kratos::Var_*const,_std::vector<std::pair<std::shared_ptr<kratos::IfStmt>,_std::shared_ptr<kratos::Const>_>,_std::allocator<std::pair<std::shared_ptr<kratos::IfStmt>,_std::shared_ptr<kratos::Const>_>_>_>_>,_std::_Select1st<std::pair<kratos::Var_*const,_std::vector<std::pair<std::shared_ptr<kratos::IfStmt>,_std::shared_ptr<kratos::Const>_>,_std::allocator<std::pair<std::shared_ptr<kratos::IfStmt>,_std::shared_ptr<kratos::Const>_>_>_>_>_>,_std::less<kratos::Var_*>,_std::allocator<std::pair<kratos::Var_*const,_std::vector<std::pair<std::shared_ptr<kratos::IfStmt>,_std::shared_ptr<kratos::Const>_>,_std::allocator<std::pair<std::shared_ptr<kratos::IfStmt>,_std::shared_ptr<kratos::Const>_>_>_>_>_>_>
    ::~_Rb_tree((_Rb_tree<kratos::Var_*,_std::pair<kratos::Var_*const,_std::vector<std::pair<std::shared_ptr<kratos::IfStmt>,_std::shared_ptr<kratos::Const>_>,_std::allocator<std::pair<std::shared_ptr<kratos::IfStmt>,_std::shared_ptr<kratos::Const>_>_>_>_>,_std::_Select1st<std::pair<kratos::Var_*const,_std::vector<std::pair<std::shared_ptr<kratos::IfStmt>,_std::shared_ptr<kratos::Const>_>,_std::allocator<std::pair<std::shared_ptr<kratos::IfStmt>,_std::shared_ptr<kratos::Const>_>_>_>_>_>,_std::less<kratos::Var_*>,_std::allocator<std::pair<kratos::Var_*const,_std::vector<std::pair<std::shared_ptr<kratos::IfStmt>,_std::shared_ptr<kratos::Const>_>,_std::allocator<std::pair<std::shared_ptr<kratos::IfStmt>,_std::shared_ptr<kratos::Const>_>_>_>_>_>_>
                 *)local_120);
  }
  return;
}

Assistant:

void static transform_block(StmtBlock* block) {
        // only run marked ones
        if (!block->has_attribute("merge_if_block")) return;
        std::map<Var*, std::vector<IfStmtType>> result;
        get_targeted_if(block, result);
        std::unordered_set<IfStmt*> merged_if;
        for (auto const& iter : result) {
            auto stmts = iter.second;
            if (stmts.size() > 1) {
                // we have stmts to merge
                auto top_if = stmts[0].first;
                // first pass to merge the if statements with the same constant value
                // build index on the const values
                std::unordered_map<int64_t, IfStmt*> mapping;
                for (const auto& [stmt, const_] : stmts) {
                    auto const_value = const_->value();
                    if (mapping.find(const_value) == mapping.end()) {
                        mapping.emplace(const_value, stmt.get());
                    } else {
                        // merge the current one into the one we already have
                        auto* if_ = mapping.at(const_value);
                        auto const& then = stmt->then_body();
                        for (auto const& st : *then) {
                            if_->add_then_stmt(st);
                        }
                        auto const& else_ = stmt->else_body();
                        for (auto const& st : *else_) {
                            if_->add_else_stmt(st);
                        }
                        merged_if.emplace(stmt.get());
                    }
                }

                // second pass to nest the if statement
                for (uint64_t i = 1; i < stmts.size(); i++) {
                    auto const& stmt = stmts[i].first;
                    if (merged_if.find(stmt.get()) != merged_if.end()) {
                        continue;
                    }
                    // put the one in the top if
                    top_if->add_else_stmt(stmt);
                    merged_if.emplace(stmt.get());
                }
            }
        }
        // remove merged if
        for (auto const& stmt : merged_if) {
            block->remove_stmt(stmt->shared_from_this());
        }
    }